

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall
TTD::EventLog::GetSnapShotBoundInterval
          (EventLog *this,int64 targetTime,int64 *snapIntervalStart,int64 *snapIntervalEnd)

{
  long lVar1;
  int iVar2;
  undefined1 local_48 [8];
  Iterator iter;
  
  *snapIntervalStart = -1;
  *snapIntervalEnd = -1;
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_48,&this->m_eventList);
  while (((local_48 != (undefined1  [8])0x0 &&
          (*(TTEventListLink **)((long)local_48 + 8) <= iter.m_currLink)) &&
         (iter.m_currLink < (TTEventListLink *)*(size_t *)local_48))) {
    if (((local_48 == (undefined1  [8])0x0) ||
        (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8))) ||
       ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink)) goto LAB_008e3940;
    if ((*(int *)(*(byte **)((long)local_48 + 0x10) + (long)iter.m_currLink) == 1) &&
       (lVar1 = *(long *)(*(byte **)((long)local_48 + 0x10) + 0x10 + (long)iter.m_currLink),
       lVar1 <= targetTime)) {
      *snapIntervalStart = lVar1;
      iVar2 = 3;
    }
    else {
      TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_48);
      iVar2 = 0;
    }
    if (iVar2 != 0) break;
  }
  while( true ) {
    if (local_48 == (undefined1  [8])0x0) {
      return;
    }
    if (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8)) {
      return;
    }
    if ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink) {
      return;
    }
    if (((local_48 == (undefined1  [8])0x0) ||
        (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8))) ||
       ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink)) break;
    if ((*(int *)(*(byte **)((long)local_48 + 0x10) + (long)iter.m_currLink) == 1) &&
       (lVar1 = *(long *)(*(byte **)((long)local_48 + 0x10) + 0x10 + (long)iter.m_currLink),
       *snapIntervalStart < lVar1)) {
      *snapIntervalEnd = lVar1;
      iVar2 = 5;
    }
    else {
      TTEventList::Iterator::MoveNext((Iterator *)local_48);
      iVar2 = 0;
    }
    if (iVar2 != 0) {
      return;
    }
  }
LAB_008e3940:
  TTDAbort_unrecoverable_error("Iterator is invalid!!!");
}

Assistant:

void EventLog::GetSnapShotBoundInterval(int64 targetTime, int64* snapIntervalStart, int64* snapIntervalEnd) const
    {
        *snapIntervalStart = -1;
        *snapIntervalEnd = -1;

        //move the iterator to the current snapshot just before the event
        auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly();
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp <= targetTime)
                {
                    *snapIntervalStart = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MovePrevious_ReplayOnly();
        }

        //now move the iter to the next snapshot
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(*snapIntervalStart < snapEvent->RestoreTimestamp)
                {
                    *snapIntervalEnd = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MoveNext();
        }
    }